

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

ostream * fasttext::utils::operator<<(ostream *out,ClockPrint *me)

{
  int iVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  ostream *poVar5;
  uint uVar6;
  
  iVar1 = me->duration_;
  iVar4 = iVar1 % 0xe10;
  sVar3 = (short)iVar4;
  uVar6 = ((uint)(sVar3 * -0x7777) >> 0x10) + iVar4;
  sVar2 = ((short)uVar6 >> 5) + (short)((uVar6 & 0xffff) >> 0xf);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)out,iVar1 / 0xe10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"h",1);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 2;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"m",1);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 2;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)out,(int)(short)(sVar3 + sVar2 * -0x3c));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ClockPrint& me) {
  int32_t etah = me.duration_ / 3600;
  int32_t etam = (me.duration_ % 3600) / 60;
  int32_t etas = (me.duration_ % 3600) % 60;

  out << std::setw(3) << etah << "h" << std::setw(2) << etam << "m";
  out << std::setw(2) << etas << "s";
  return out;
}